

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O3

void print_rel(wchar_t c,uint8_t a,wchar_t y,wchar_t x)

{
  term *t;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t a_00;
  int iVar6;
  undefined7 in_register_00000031;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  wchar_t wVar11;
  wchar_t j;
  long lVar12;
  uint uVar13;
  
  a_00 = (wchar_t)CONCAT71(in_register_00000031,a);
  lVar12 = 0;
  do {
    t = angband_term[lVar12];
    if ((t != (term *)0x0) && ((window_flag[lVar12] & 0xa0) != 0)) {
      uVar10 = (uint)tile_height;
      if ((window_flag[lVar12] & 0x20) == 0) {
        wVar11 = y - t->offset_y;
        if ((tile_height < 2) || (wVar11 = wVar11 * uVar10, wVar11 + L'\x01' < t->hgt)) {
          wVar4 = x - t->offset_x;
          if ((tile_width < 2) || (wVar4 = wVar4 * (uint)tile_width, wVar4 + L'\x01' < t->wid))
          goto LAB_001f3d01;
        }
      }
      else {
        iVar6 = cave->height;
        iVar5 = cave->width;
        iVar8 = t->hgt + -2;
        iVar3 = iVar6;
        if (1 < tile_height) {
          iVar3 = uVar10 - iVar6 % (int)uVar10;
          if (iVar6 % (int)uVar10 < 1) {
            iVar3 = 0;
          }
          iVar8 = iVar8 - iVar8 % (int)uVar10;
          iVar3 = iVar3 + iVar6;
        }
        iVar7 = t->wid + -2;
        uVar13 = (uint)tile_width;
        iVar9 = iVar5;
        if (1 < tile_width) {
          iVar9 = uVar13 - iVar5 % (int)uVar13;
          if (iVar5 % (int)uVar13 < 1) {
            iVar9 = 0;
          }
          iVar7 = iVar7 - iVar7 % (int)uVar13;
          iVar9 = iVar9 + iVar5;
        }
        if (iVar8 < iVar3) {
          iVar3 = iVar8;
        }
        if (iVar7 < iVar9) {
          iVar9 = iVar7;
        }
        uVar1 = (long)(iVar9 * x) / (long)iVar5;
        iVar5 = (int)uVar1;
        uVar2 = (long)(iVar3 * y) / (long)iVar6;
        iVar6 = (int)uVar2;
        if (1 < tile_width) {
          iVar5 = iVar5 - (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                               (long)(int)uVar13);
        }
        if (1 < tile_height) {
          iVar6 = iVar6 - (int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                               (long)(int)uVar10);
        }
        wVar4 = iVar5 + L'\x01';
        wVar11 = iVar6 + L'\x01';
LAB_001f3d01:
        if (((((L'\xffffffff' < wVar11) && (wVar11 < t->hgt)) && (L'\xffffffff' < wVar4)) &&
            (wVar4 < t->wid)) &&
           ((Term_queue_char(t,wVar4,wVar11,a_00,c,L'\0',L'\0'), 1 < tile_width || (1 < tile_height)
            ))) {
          iVar6 = 0;
          if ((window_flag[lVar12] & 0x80) == 0) {
            iVar6 = row_bottom_map[Term->sidebar_mode];
          }
          Term_big_queue_char(t,wVar4,wVar11,t->hgt - iVar6,a_00,c,L'\0',L'\0');
        }
      }
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 8) {
      iVar6 = y - Term->offset_y;
      if (-1 < iVar6) {
        iVar5 = Term->sidebar_mode;
        if ((iVar6 < (Term->hgt - (row_bottom_map[iVar5] + row_top_map[iVar5])) /
                     (int)(uint)tile_height) && (iVar3 = x - Term->offset_x, -1 < iVar3)) {
          if (iVar3 < (~col_map[iVar5] + Term->wid) / (int)(uint)tile_width) {
            wVar4 = iVar3 * (uint)tile_width + col_map[iVar5];
            wVar11 = iVar6 * (uint)tile_height + row_top_map[iVar5];
            Term_queue_char(Term,wVar4,wVar11,a_00,c,L'\0',L'\0');
            if ((1 < tile_width) || (1 < tile_height)) {
              Term_big_queue_char(Term,wVar4,wVar11,Term->hgt - row_bottom_map[Term->sidebar_mode],
                                  a_00,c,L'\0',L'\0');
            }
          }
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void print_rel(wchar_t c, uint8_t a, int y, int x)
{
	int ky, kx;
	int vy, vx;

	/* Print on map sub-windows */
	print_rel_map(c, a, y, x);

	/* Location relative to panel */
	ky = y - Term->offset_y;

	/* Verify location */
	if ((ky < 0) || (ky >= SCREEN_HGT)) return;

	/* Location relative to panel */
	kx = x - Term->offset_x;

	/* Verify location */
	if ((kx < 0) || (kx >= SCREEN_WID)) return;

	/* Get right position */
	vx = COL_MAP + (tile_width * kx);
	vy = ROW_MAP + (tile_height * ky);

	/* Hack -- Queue it */
	Term_queue_char(Term, vx, vy, a, c, 0, 0);

	if ((tile_width > 1) || (tile_height > 1))
		Term_big_queue_char(Term, vx, vy, ROW_MAP + SCREEN_ROWS,
			a, c, 0, 0);
  
}